

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

void __thiscall
CVmObjGramProd::enqueue_alts
          (CVmObjGramProd *this,CVmGramProdMem *mem,vmgramprod_tok *tok,size_t tok_cnt,
          size_t start_tok_pos,CVmGramProdState *enclosing_state,CVmGramProdQueue *queues,
          vm_obj_id_t self,int circ_only,CVmGramProdMatch *circ_match,CVmObjDict *dict)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  CVmGramProdState *pCVar8;
  CVmGramProdMatch *pCVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  bool bVar15;
  uint local_b4;
  vm_prop_id_t *local_b0;
  int need_to_clone;
  CVmGramProdMem *local_a0;
  size_t local_98;
  undefined8 local_90;
  long local_88;
  long *local_80;
  vmgramprod_tok *local_78;
  size_t local_70;
  ulong local_68;
  CVmGramProdState *local_60;
  vm_prop_id_t *local_58;
  long local_50;
  long local_48;
  vm_val_t match_result;
  
  need_to_clone = circ_only;
  pcVar7 = (this->super_CVmObject).ext_;
  uVar1 = *(uint *)(pcVar7 + 0x14);
  if (dict == (CVmObjDict *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = *(int *)((dict->super_CVmObject).ext_ + 0x20);
  }
  local_a0 = mem;
  local_98 = start_tok_pos;
  local_60 = enclosing_state;
  if (((uVar1 & 2) == 0) || (*(int *)(pcVar7 + 0x10) != iVar6)) {
    cache_hashes(this,dict);
    pcVar7 = (this->super_CVmObject).ext_;
  }
  local_80 = *(long **)(pcVar7 + 0x30);
  local_50 = *(long *)(pcVar7 + 0x38);
  local_78 = tok;
  local_70 = tok_cnt;
  do {
    bVar15 = local_50 == 0;
    local_50 = local_50 + -1;
    if (bVar15) {
      return;
    }
    local_b0 = *(vm_prop_id_t **)(*local_80 + 0x10);
    local_88 = *(long *)(*local_80 + 0x18);
    uVar12 = 0;
    if ((local_88 == 0) || ((char)local_b0[1] != '\x01')) {
      local_90 = 0;
    }
    else {
      local_90 = CONCAT71((int7)((ulong)local_80 >> 8),*(vm_obj_id_t *)(local_b0 + 4) == self);
    }
    lVar11 = 0;
    sVar14 = local_98;
    local_58 = local_b0;
LAB_00256588:
    bVar10 = (byte)local_90;
    if (lVar11 != local_88) {
      local_b4 = 0;
      local_48 = lVar11;
      do {
        bVar15 = true;
        switch((char)local_b0[1]) {
        case '\x01':
          if (((lVar11 == 0 && circ_only != 0) & bVar10) == 0) {
            uVar12 = 1;
          }
          uVar12 = uVar12 & 0xffffffff;
          bVar4 = true;
          uVar5 = 0;
          bVar15 = false;
          goto LAB_002566dc;
        case '\x02':
          uVar5 = 0;
          if (sVar14 < tok_cnt) {
            uVar5 = find_prop_in_tok(tok + sVar14,local_b0[4]);
          }
          break;
        case '\x03':
          uVar5 = 0;
          if (sVar14 < tok_cnt) {
            if (tok[sVar14].txt_ == (char *)0x0) goto switchD_002565d9_default;
            uVar5 = 0;
            if (*(uint *)(local_b0 + 0xc) == tok[sVar14].hash_) {
              iVar6 = tok_equals_lit(tok + sVar14,*(char **)(local_b0 + 4),*(size_t *)(local_b0 + 8)
                                     ,dict,&match_result);
              uVar5 = (uint)(iVar6 != 0);
            }
          }
          break;
        case '\x04':
          uVar5 = 0;
          if (sVar14 < tok_cnt) {
            uVar5 = (uint)(tok[sVar14].typ_ == (ulong)*(uint *)(local_b0 + 4));
          }
          break;
        case '\x05':
          bVar4 = false;
          uVar5 = 1;
          sVar14 = tok_cnt;
          local_b4 = uVar5;
          goto LAB_002566dc;
        case '\x06':
          uVar5 = 0;
          if (tok_cnt <= sVar14) break;
          lVar2 = *(long *)(local_b0 + 4);
          lVar3 = *(long *)(local_b0 + 8);
          local_68 = uVar12;
          for (lVar13 = 0; lVar2 != lVar13; lVar13 = lVar13 + 1) {
            iVar6 = find_prop_in_tok(tok + sVar14,*(vm_prop_id_t *)(lVar3 + lVar13 * 2));
            if (iVar6 != 0) {
              uVar5 = 1;
              goto LAB_00256704;
            }
          }
          uVar5 = 0;
LAB_00256704:
          bVar4 = false;
          uVar12 = local_68;
          tok_cnt = local_70;
          tok = local_78;
          goto LAB_002566dc;
        default:
switchD_002565d9_default:
          uVar5 = 0;
        }
        bVar4 = false;
LAB_002566dc:
        if (((uVar5 != 0) || ((int)uVar12 == 0)) || (bVar4)) goto LAB_0025671c;
        if (tok_cnt <= sVar14) goto LAB_00256804;
        sVar14 = sVar14 + 1;
      } while( true );
    }
    if (((circ_only == 0) != (bool)bVar10) &&
       (pCVar8 = enqueue_new_state(local_a0,local_98,local_60,(vmgram_alt_info *)*local_80,self,
                                   &need_to_clone,queues,uVar1 >> 2 & 1), circ_only != 0)) {
      pCVar9 = CVmGramProdMatch::alloc
                         (local_a0,0,(vm_val_t *)0x0,0,*local_58,circ_match->proc_obj_,
                          circ_match->sub_match_list_,circ_match->sub_match_cnt_);
      pCVar8->match_list_[0] = pCVar9;
      pCVar8->alt_pos_ = 1;
    }
LAB_00256804:
    local_80 = local_80 + 1;
  } while( true );
LAB_0025671c:
  if (uVar5 == 0) {
    if (bVar15) goto LAB_00256804;
  }
  else {
    sVar14 = sVar14 + (sVar14 < tok_cnt && local_b4 == 0);
  }
  lVar11 = local_48 + 1;
  local_b0 = local_b0 + 0x10;
  goto LAB_00256588;
}

Assistant:

void CVmObjGramProd::enqueue_alts(VMG_ CVmGramProdMem *mem,
                                  const vmgramprod_tok *tok,
                                  size_t tok_cnt, size_t start_tok_pos,
                                  CVmGramProdState *enclosing_state,
                                  CVmGramProdQueue *queues, vm_obj_id_t self,
                                  int circ_only,
                                  CVmGramProdMatch *circ_match,
                                  CVmObjDict *dict)
{
    vmgram_alt_info *const *altp;
    size_t i;
    int need_to_clone;
    int has_circ;
    vm_obj_id_t comparator;

    /* 
     *   We don't need to clone the enclosing state until we've set up one
     *   new state referring back to it.  However, if we're doing circular
     *   alternatives, the enclosing state could also be enqueued
     *   separately as its own state, so do clone all required copies in
     *   this case.  
     */
    need_to_clone = circ_only;

    /* note whether or not we have any circular alternatives */
    has_circ = get_ext()->has_circular_alt;

    /* 
     *   Cache hash values for all of our literals.  We need to do this if we
     *   haven't done it before, or if the comparator associated with the
     *   dictionary is different than it was last time we cached the values. 
     */
    comparator = (dict != 0 ? dict->get_comparator() : VM_INVALID_OBJ);
    if (!get_ext()->hashes_cached_ || get_ext()->comparator_ != comparator)
        cache_hashes(vmg_ dict);

    /* 
     *   run through our alternatives and enqueue each one that looks
     *   plausible 
     */
    for (altp = get_ext()->alts_, i = get_ext()->alt_cnt_ ; i != 0 ;
         --i, ++altp)
    {
        /* start at the first token remaining in the string */
        size_t tok_idx = start_tok_pos;

        /* get the first token for this alternative */
        vmgram_tok_info *first_tokp = (*altp)->toks;

        /* start at the first token */
        vmgram_tok_info *tokp = first_tokp;

        /* get the number of tokens in the alternative */
        size_t alt_tok_cnt = (*altp)->tok_cnt;
        
        /* presume we will find no mismatches in this check */
        int found_mismatch = FALSE;

        /* 
         *   note whether this alternative is a direct circular reference
         *   or not (it is directly circular if the first token points
         *   back to this same production) 
         */
        int is_circ = (alt_tok_cnt != 0
                       && tokp->typ == VMGRAM_MATCH_PROD
                       && tokp->typinfo.prod_obj == self);
        
        /* 
         *   we don't have a production before the current item (this is
         *   important because it determines whether we must consider the
         *   current token or any following token when trying to match a
         *   literal, part of speech, or token type) 
         */
        int prod_before = FALSE;

        /* scan the tokens in the alternative */
        for (size_t cur_alt_tok = 0 ; cur_alt_tok < alt_tok_cnt ;
             ++cur_alt_tok, ++tokp)
        {
            int match;
            int match_star;
            int ignore_item;
            vm_val_t match_result;

            /* presume we won't find a match */
            match = FALSE;
            match_star = FALSE;

            /* presume we won't be able to ignore the item */
            ignore_item = FALSE;

            /* 
             *   Try to find a match to the current alternative item.  If
             *   we've already found a mismatch, don't bother, since we need
             *   no further evidence to skip this alternative; in this case
             *   we're still looping over the alternative items simply to
             *   find the beginning of the next alternative.  
             */
            for ( ; !found_mismatch ; ++tok_idx)
            {
                /* see what kind of item we have */
                switch(tokp->typ)
                {
                case VMGRAM_MATCH_PROD:
                    /* 
                     *   We can't rule out a production without checking
                     *   it fully, which we're not doing on this pass;
                     *   however, note that we found a production, because
                     *   it means that we must from now on try skipping
                     *   any number of tokens before ruling out a match on
                     *   other grounds, since the production could
                     *   potentially match any number of tokens.
                     *   
                     *   If we're doing circular matches only, and this is
                     *   a circular production, and we're on the first
                     *   token in our list, we already know it matches, so
                     *   don't even count it as a production before the
                     *   item.  
                     */
                    if (is_circ && circ_only && cur_alt_tok == 0)
                    {
                        /* 
                         *   ignore the fact that it's a production, since
                         *   we already know it matches - we don't want to
                         *   be flexible about tokens following this item
                         *   since we know the exact number that match it 
                         */
                    }
                    else
                    {
                        /* note the production item */
                        prod_before = TRUE;
                    }

                    /* 
                     *   we can ignore this item for the purposes of
                     *   detecting a mismatch, because we can't tell
                     *   during this superficial scan whether it matches 
                     */
                    ignore_item = TRUE;
                    break;
                
                case VMGRAM_MATCH_SPEECH:
                    /* we must match a part of speech */
                    if (tok_idx < tok_cnt
                        && find_prop_in_tok(&tok[tok_idx],
                                            tokp->typinfo.speech_prop))
                    {
                        /* it's a match */
                        match = TRUE;
                    }
                    break;

                case VMGRAM_MATCH_NSPEECH:
                    /* multiple parts of speech */
                    if (tok_idx < tok_cnt)
                    {
                        vm_prop_id_t *prop;
                        size_t rem;

                        /* presume we won't find a match */
                        match = FALSE;

                        /* check each item in the list */
                        for (prop = tokp->typinfo.nspeech.props,
                             rem = tokp->typinfo.nspeech.cnt ; rem != 0 ;
                             --rem, ++prop)
                        {
                            /* if this one matches, we have a match */
                            if (find_prop_in_tok(&tok[tok_idx], *prop))
                            {
                                /* note the match */
                                match = TRUE;

                                /* no need to look any further */
                                break;
                            }
                        }
                    }
                    else
                    {
                        /* we're out of tokens, so we have no match */
                        match = FALSE;
                    }
                    break;
                    
                case VMGRAM_MATCH_LITERAL:
                    /* 
                     *   Match a literal.  Compare the hash values first,
                     *   since a negative match on the hash values will tell
                     *   us for sure that the text won't match; since not
                     *   matching is by far the most common case, this saves
                     *   us the work of doing full string comparisons most of
                     *   the time. 
                     */
                    if (tok_idx < tok_cnt
                        && tok[tok_idx].txt_ != 0
                        && tokp->typinfo.lit.hash == tok[tok_idx].hash_
                        && tok_equals_lit(vmg_ &tok[tok_idx],
                                          tokp->typinfo.lit.str,
                                          tokp->typinfo.lit.len,
                                          dict, &match_result))
                    {
                        /* it's a match */
                        match = TRUE;
                    }
                    break;
                
                case VMGRAM_MATCH_TOKTYPE:
                    /* we must match a token type */
                    if (tok_idx < tok_cnt
                        && tok[tok_idx].typ_ == tokp->typinfo.toktyp_enum)
                        match = TRUE;
                    break;

                case VMGRAM_MATCH_STAR:
                    /* consume everything remaining on the line */
                    tok_idx = tok_cnt;

                    /* this is a match */
                    match = TRUE;
                    match_star = TRUE;
                    break;
                }

                /* if we found a match, we can stop scanning now */
                if (match)
                    break;

                /* 
                 *   we didn't match this token - if we have a production
                 *   before this point, we must keep scanning token, since
                 *   the production could end up matching any number of
                 *   tokens; if we don't have a production item, though,
                 *   we don't need to look any further, and we can rule
                 *   out this alternative immediately 
                 */
                if (!prod_before)
                    break;

                /* 
                 *   if we're ignoring this item (because we can't decide
                 *   now whether it's a match or not, and hence can't rule
                 *   it out), don't scan any tokens for the item 
                 */
                if (ignore_item)
                    break;

                /* 
                 *   if we didn't find a match, and we're out of tokens,
                 *   stop looking - we have no more tokens to look at to
                 *   find a match 
                 */
                if (!match && tok_idx >= tok_cnt)
                    break;
            }

            /* check to see if we found a match */
            if (match)
            {
                /* 
                 *   we found a match - skip the current token (unless we
                 *   matched a '*' item, in which case we've already
                 *   consumed all remaining tokens) 
                 */
                if (!match_star && tok_idx < tok_cnt)
                    ++tok_idx;
            }
            else if (!ignore_item)
            {
                /* 
                 *   we didn't match, and we can't ignore this item - note
                 *   that the alternative does not match 
                 */
                found_mismatch = TRUE;

                /* finish up with this alternative and proceed to the next */
                break;
            }
        }

        /* 
         *   If we didn't find a reason to rule out this alternative,
         *   enqueue the alternative.  Never enqueue circular references,
         *   unless we're ONLY enqueuing circular references.
         */
        if (!found_mismatch
            && ((!circ_only && !is_circ)
                || (circ_only && is_circ)))
        {
            CVmGramProdState *state;
            
            /* create and enqueue the new state */
            state = enqueue_new_state(mem, start_tok_pos, enclosing_state,
                                      *altp, self, &need_to_clone, queues,
                                      has_circ);

            /* 
             *   if we are enqueuing circular references, we already have
             *   a match for the first (circular) token, so fill it in 
             */
            if (circ_only)
            {
                CVmGramProdMatch *match;
                
                /* create a match for the alternative */
                match = CVmGramProdMatch::
                        alloc(mem, 0, 0, FALSE, first_tokp->prop,
                              circ_match->proc_obj_,
                              circ_match->sub_match_list_,
                              circ_match->sub_match_cnt_);

                /* set the first match in the token */
                state->match_list_[0] = match;

                /* set up at the second token */
                state->alt_pos_ = 1;
            }
        }
    }
}